

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  longlong lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m128i *palVar13;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  int64_t *piVar20;
  char *__format;
  ulong uVar21;
  long lVar22;
  long lVar23;
  __m128i *ptr_02;
  int iVar24;
  ulong size;
  ulong uVar25;
  ulong uVar26;
  longlong lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 extraout_XMM0 [16];
  longlong lVar39;
  undefined1 extraout_XMM0_00 [16];
  __m128i_64_t B_4;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  long lVar47;
  __m128i_64_t B;
  long lVar49;
  undefined1 auVar48 [16];
  int64_t iVar50;
  undefined1 auVar51 [16];
  ulong uVar52;
  long lVar53;
  __m128i_64_t B_1;
  long lVar55;
  undefined1 auVar54 [16];
  __m128i b;
  __m128i b_00;
  __m128i a;
  __m128i a_00;
  long local_158;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  int iStack_100;
  long local_f8;
  long lStack_f0;
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "profile->matrix";
      }
      else {
        uVar10 = profile->s1Len;
        if ((int)uVar10 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar18 = "s2";
        }
        else {
          uVar26 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar18 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar18 = "open";
          }
          else {
            if (-1 < gap) {
              uVar8 = uVar10 - 1;
              size = (ulong)uVar10 + 1 >> 1;
              uVar16 = (ulong)(uint)open;
              iVar24 = -open;
              iVar11 = ppVar3->min;
              uVar25 = 0x8000000000000000 - (long)iVar11;
              if (iVar11 != iVar24 && SBORROW4(iVar11,iVar24) == iVar11 + open < 0) {
                uVar25 = uVar16 | 0x8000000000000000;
              }
              iVar11 = ppVar3->max;
              ppVar12 = parasail_result_new_table1((uint)((ulong)uVar10 + 1) & 0x7ffffffe,s2Len);
              if (ppVar12 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              ppVar12->flag = ppVar12->flag | 0x2820801;
              palVar13 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 == (int64_t *)0x0 || ptr_00 == (__m128i *)0x0) ||
                  (ptr == (__m128i *)0x0 || palVar13 == (__m128i *)0x0)) {
                return (parasail_result_t *)0x0;
              }
              iVar9 = s2Len + -1;
              uVar10 = 1 - (int)(uVar8 / size);
              uVar52 = (ulong)(uint)gap;
              lVar14 = uVar25 + 1;
              lVar19 = 0x7ffffffffffffffe - (long)iVar11;
              auVar42._8_4_ = (int)lVar14;
              auVar42._0_8_ = lVar14;
              auVar42._12_4_ = (int)((ulong)lVar14 >> 0x20);
              auVar43._8_4_ = (int)lVar19;
              auVar43._0_8_ = lVar19;
              auVar43._12_4_ = (int)((ulong)lVar19 >> 0x20);
              uVar15 = (ulong)(uint)gap;
              lVar19 = (long)iVar24;
              lVar14 = lVar19;
              for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                lVar22 = lVar14;
                for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
                  *(long *)((long)&h + lVar23 * 8) = lVar22;
                  *(ulong *)((long)&e + lVar23 * 8) = lVar22 - uVar16;
                  lVar22 = lVar22 - size * uVar15;
                }
                palVar13[uVar21][0] = h.m[0];
                palVar13[uVar21][1] = h.m[1];
                *(__m128i_64_t *)(ptr_00 + uVar21) = e;
                lVar14 = lVar14 - uVar15;
              }
              *ptr_01 = 0;
              for (uVar21 = 1; s2Len + 1 != uVar21; uVar21 = uVar21 + 1) {
                ptr_01[uVar21] = lVar19;
                lVar19 = lVar19 - uVar15;
              }
              lVar14 = size * uVar26 * 4;
              local_158 = 0;
              uVar15 = 0;
              piVar20 = ptr_01;
              auVar46 = auVar42;
              do {
                ptr_02 = palVar13;
                if (uVar15 == uVar26) {
                  b_00[0] = (ulong)uVar10;
                  iVar11 = 0;
                  lVar7 = ptr_02[(ulong)uVar8 % size][0];
                  lVar39 = ptr_02[(ulong)uVar8 % size][1];
                  while (lVar27 = lVar7, iVar11 < (int)uVar10) {
                    lVar7 = 0;
                    lVar39 = lVar27;
                    iVar11 = 1;
                  }
                  b_00[1] = 1;
                  a_00[1] = (longlong)piVar20;
                  a_00[0] = (longlong)ppVar12;
                  _mm_cmpgt_epi64_rpl(a_00,b_00);
                  local_f8 = auVar43._0_8_;
                  lStack_f0 = auVar43._8_8_;
                  auVar44._0_8_ = -(ulong)((long)uVar25 < local_f8);
                  auVar44._8_8_ = -(ulong)((long)uVar25 < lStack_f0);
                  auVar46._8_4_ = 0xffffffff;
                  auVar46._0_8_ = 0xffffffffffffffff;
                  auVar46._12_4_ = 0xffffffff;
                  auVar42 = auVar46 ^ auVar44 | extraout_XMM0_00;
                  if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar42 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar42 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar42 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar42 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar42 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar42 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar42 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar42 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar42 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar42[0xf]) {
                    iStack_100 = (int)lVar39;
                  }
                  else {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    iStack_100 = 0;
                    iVar9 = 0;
                    uVar8 = 0;
                  }
                  ppVar12->score = iStack_100;
                  ppVar12->end_query = uVar8;
                  ppVar12->end_ref = iVar9;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar12;
                }
                palVar13 = ptr_02 + ((int)size - 1);
                auVar45._8_4_ = (int)(*palVar13)[0];
                auVar45._0_8_ = (*palVar13)[0];
                auVar45._12_4_ = *(undefined4 *)((long)*palVar13 + 4);
                iVar11 = ppVar3->mapper[(byte)s2[uVar15]];
                iVar50 = ptr_01[uVar15];
                lVar19 = auVar45._8_8_;
                lVar22 = local_158;
                auVar41 = auVar42;
                for (lVar23 = 0; uVar21 = (ulong)(uint)gap, size * 0x10 != lVar23;
                    lVar23 = lVar23 + 0x10) {
                  plVar1 = (long *)((long)pvVar2 + lVar23 + (long)(iVar11 * (int)size) * 0x10);
                  auVar51._0_8_ = iVar50 + *plVar1;
                  auVar51._8_8_ = lVar19 + plVar1[1];
                  auVar44 = *(undefined1 (*) [16])((long)*ptr_00 + lVar23);
                  lVar47 = auVar44._0_8_;
                  auVar28._0_8_ = -(ulong)(lVar47 < auVar51._0_8_);
                  lVar49 = auVar44._8_8_;
                  auVar28._8_8_ = -(ulong)(lVar49 < auVar51._8_8_);
                  auVar45 = blendvpd(auVar44,auVar51,auVar28);
                  lVar53 = auVar41._0_8_;
                  auVar29._0_8_ = -(ulong)(lVar53 < auVar45._0_8_);
                  lVar55 = auVar41._8_8_;
                  auVar29._8_8_ = -(ulong)(lVar55 < auVar45._8_8_);
                  auVar45 = blendvpd(auVar41,auVar45,auVar29);
                  *(undefined1 (*) [16])((long)*ptr + lVar23) = auVar45;
                  lVar19 = auVar45._0_8_;
                  auVar30._0_8_ = -(ulong)(lVar19 < auVar46._0_8_);
                  lVar17 = auVar45._8_8_;
                  auVar30._8_8_ = -(ulong)(lVar17 < auVar46._8_8_);
                  auVar46 = blendvpd(auVar45,auVar46,auVar30);
                  auVar31._0_8_ = -(ulong)(auVar43._0_8_ < lVar19);
                  auVar31._8_8_ = -(ulong)(auVar43._8_8_ < lVar17);
                  auVar43 = blendvpd(auVar45,auVar43,auVar31);
                  auVar32._0_8_ = -(ulong)(auVar43._0_8_ < lVar47);
                  auVar32._8_8_ = -(ulong)(auVar43._8_8_ < lVar49);
                  auVar43 = blendvpd(auVar44,auVar43,auVar32);
                  auVar33._0_8_ = -(ulong)(auVar43._0_8_ < lVar53);
                  auVar33._8_8_ = -(ulong)(auVar43._8_8_ < lVar55);
                  auVar43 = blendvpd(auVar41,auVar43,auVar33);
                  piVar4 = ((ppVar12->field_4).rowcols)->score_row;
                  *(int *)((long)piVar4 + lVar22) = auVar45._0_4_;
                  piVar20 = (int64_t *)((long)piVar4 + lVar22);
                  *(int *)(lVar14 + (long)piVar20) = auVar45._8_4_;
                  auVar40._0_8_ = lVar19 - uVar16;
                  auVar40._8_8_ = lVar17 - (ulong)(uint)open;
                  auVar48._0_8_ = lVar47 - uVar52;
                  auVar48._8_8_ = lVar49 - uVar21;
                  auVar34._0_8_ = -(ulong)(auVar40._0_8_ < auVar48._0_8_);
                  auVar34._8_8_ = -(ulong)(auVar40._8_8_ < auVar48._8_8_);
                  auVar44 = blendvpd(auVar40,auVar48,auVar34);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar23) = auVar44;
                  auVar54._0_8_ = lVar53 - uVar52;
                  auVar54._8_8_ = lVar55 - uVar21;
                  auVar35._0_8_ = -(ulong)(auVar40._0_8_ < auVar54._0_8_);
                  auVar35._8_8_ = -(ulong)(auVar40._8_8_ < auVar54._8_8_);
                  auVar41 = blendvpd(auVar40,auVar54,auVar35);
                  plVar1 = (long *)((long)*ptr_02 + lVar23);
                  iVar50 = *plVar1;
                  lVar19 = plVar1[1];
                  lVar22 = lVar22 + uVar26 * 4;
                }
                for (iVar11 = 0; iVar11 != 2; iVar11 = iVar11 + 1) {
                  lVar19 = ptr_01[uVar15 + 1] - uVar16;
                  lVar22 = auVar41._0_8_;
                  lVar23 = local_158;
                  lVar17 = 0;
                  while( true ) {
                    uStack_12c = (undefined4)((ulong)lVar22 >> 0x20);
                    uStack_130 = (undefined4)lVar22;
                    if (size * 0x10 + 0x10 == lVar17 + 0x10) break;
                    auVar44 = *(undefined1 (*) [16])((long)*ptr + lVar17);
                    auVar6._8_4_ = uStack_130;
                    auVar6._0_8_ = lVar19;
                    auVar6._12_4_ = uStack_12c;
                    auVar36._0_8_ = -(ulong)(lVar19 < auVar44._0_8_);
                    auVar36._8_8_ = -(ulong)(auVar6._8_8_ < auVar44._8_8_);
                    auVar44 = blendvpd(auVar6,auVar44,auVar36);
                    *(undefined1 (*) [16])((long)*ptr + lVar17) = auVar44;
                    auVar37._0_8_ = -(ulong)(auVar43._0_8_ < auVar44._0_8_);
                    auVar37._8_8_ = -(ulong)(auVar43._8_8_ < auVar44._8_8_);
                    auVar43 = blendvpd(auVar44,auVar43,auVar37);
                    piVar4 = ((ppVar12->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar23) = auVar44._0_4_;
                    uVar5 = extractps(auVar44,2);
                    *(undefined8 *)(lVar14 + (long)piVar4 + lVar23) = uVar5;
                    auVar38._0_8_ = -(ulong)(auVar44._0_8_ < auVar46._0_8_);
                    auVar38._8_8_ = -(ulong)(auVar44._8_8_ < auVar46._8_8_);
                    auVar46 = blendvpd(auVar44,auVar46,auVar38);
                    lVar19 = lVar19 - uVar52;
                    lVar22 = auVar6._8_8_ - uVar21;
                    b[1] = (longlong)piVar4;
                    b[0] = (long)piVar4 + lVar23;
                    a[1] = (longlong)piVar20;
                    a[0] = (longlong)ppVar12;
                    _mm_cmpgt_epi64_rpl(a,b);
                    lVar23 = lVar23 + uVar26 * 4;
                    lVar17 = lVar17 + 0x10;
                    if ((((((((((((((((extraout_XMM0 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (extraout_XMM0 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (extraout_XMM0 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (extraout_XMM0 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (extraout_XMM0 >> 0x27 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (extraout_XMM0 >> 0x2f & (undefined1  [16])0x1) ==
                                 (undefined1  [16])0x0) &&
                                (extraout_XMM0 >> 0x37 & (undefined1  [16])0x1) ==
                                (undefined1  [16])0x0) &&
                               (extraout_XMM0 >> 0x3f & (undefined1  [16])0x1) ==
                               (undefined1  [16])0x0) &&
                              (extraout_XMM0 >> 0x47 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) &&
                             (extraout_XMM0 >> 0x4f & (undefined1  [16])0x1) ==
                             (undefined1  [16])0x0) &&
                            (extraout_XMM0 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                            ) && (extraout_XMM0 >> 0x5f & (undefined1  [16])0x1) ==
                                 (undefined1  [16])0x0) &&
                          (extraout_XMM0 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                         && (extraout_XMM0 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                         ) && (extraout_XMM0 >> 0x77 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) && -1 < extraout_XMM0[0xf]) goto LAB_00666402;
                  }
                  auVar41._8_4_ = uStack_130;
                  auVar41._0_8_ = lVar19;
                  auVar41._12_4_ = uStack_12c;
                }
LAB_00666402:
                uVar15 = uVar15 + 1;
                local_158 = local_158 + 4;
                palVar13 = ptr;
                ptr = ptr_02;
              } while( true );
            }
            __format = "%s: %s must be >= 0\n";
            pcVar18 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_striped_profile_sse41_128_64",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}